

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

void __thiscall
pbrt::LightBase::LightBase
          (LightBase *this,LightType type,Transform *renderFromLight,
          MediumInterface *mediumInterface)

{
  MediumInterface *in_RCX;
  void *in_RDX;
  undefined4 in_ESI;
  MediumInterface *in_RDI;
  long *in_FS_OFFSET;
  
  *(undefined4 *)
   &(in_RDI->inside).
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = in_ESI;
  MediumInterface::MediumInterface(in_RCX,in_RDI);
  memcpy(&in_RDI[1].outside,in_RDX,0x80);
  *(long *)(*in_FS_OFFSET + -0x550) = *(long *)(*in_FS_OFFSET + -0x550) + 1;
  return;
}

Assistant:

LightBase::LightBase(LightType type, const Transform &renderFromLight,
                     const MediumInterface &mediumInterface)
    : type(type), mediumInterface(mediumInterface), renderFromLight(renderFromLight) {
    ++numLights;
}